

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplification_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::SimplificationPass::AddNewOperands
          (SimplificationPass *this,Instruction *folded_inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *inst_seen,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *work_list)

{
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *work_list_local;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *inst_seen_local;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  work_list_local = work_list;
  inst_seen_local = inst_seen;
  def_use_mgr = Pass::get_def_use_mgr(&this->super_Pass);
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ***)local_48._M_unused._0_8_ = &inst_seen_local;
  *(DefUseManager ***)((long)local_48._M_unused._0_8_ + 8) = &def_use_mgr;
  *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> ***)
   ((long)local_48._M_unused._0_8_ + 0x10) = &work_list_local;
  local_30 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/simplification_pass.cpp:39:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/simplification_pass.cpp:39:7)>
             ::_M_manager;
  Instruction::ForEachInId(folded_inst,(function<void_(unsigned_int_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void SimplificationPass::AddNewOperands(
    Instruction* folded_inst, std::unordered_set<Instruction*>* inst_seen,
    std::vector<Instruction*>* work_list) {
  analysis::DefUseManager* def_use_mgr = get_def_use_mgr();
  folded_inst->ForEachInId(
      [&inst_seen, &def_use_mgr, &work_list](uint32_t* iid) {
        Instruction* iid_inst = def_use_mgr->GetDef(*iid);
        if (!inst_seen->insert(iid_inst).second) return;
        work_list->push_back(iid_inst);
      });
}